

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.h
# Opt level: O3

QString * __thiscall
DumpWrapperToFileCommand::makeFileName
          (QString *__return_storage_ptr__,DumpWrapperToFileCommand *this,offset_t wrapperOffset)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  stringstream sstr;
  long *local_1d8;
  long local_1c8 [2];
  Data *local_1b8;
  char16_t *pcStack_1b0;
  qsizetype local_1a8;
  stringstream local_1a0 [16];
  long local_190 [3];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"wrapper",7);
  if (wrapperOffset != 0xffffffffffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_at_",4);
    *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
         *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".bin",4);
  std::__cxx11::stringbuf::str();
  if (local_1d8 == (long *)0x0) {
    psVar1 = (storage_type *)0x0;
  }
  else {
    psVar1 = (storage_type *)strlen((char *)local_1d8);
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_1b8;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).d = local_1b8;
  (__return_storage_ptr__->d).ptr = pcStack_1b0;
  (__return_storage_ptr__->d).size = local_1a8;
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

QString makeFileName(const offset_t wrapperOffset) 
    {
        std::stringstream sstr;
        sstr << "wrapper";
        if (wrapperOffset != INVALID_ADDR) {
            sstr << "_at_" << std::hex << wrapperOffset;
        }
        sstr << ".bin";
        return QString(sstr.str().c_str());
    }